

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseRestrictedAlphabet(CFIReaderImpl *this,size_t index,size_t len)

{
  size_type sVar1;
  ulong uVar2;
  DeadlyImportError *pDVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> result;
  uint uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  ulong value;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  shared_ptr<const_Assimp::FIValue> sVar10;
  string s;
  string local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> alphabetUTF32;
  string alphabet;
  
  alphabet._M_dataplus._M_p = (pointer)&alphabet.field_2;
  alphabet._M_string_length = 0;
  alphabet.field_2._M_local_buf[0] = '\0';
  if (len < 0x10) {
    if ((len != 1) && (len != 0)) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_a8,len);
      std::operator+(&s,"Invalid restricted alphabet index ",&local_a8);
      DeadlyImportError::DeadlyImportError(pDVar3,&s);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    result.container = in_RCX;
    std::__cxx11::string::assign((char *)&alphabet);
  }
  else {
    result.container =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         (*(long *)(index + 0x30) - *(long *)(index + 0x28) >> 5);
    if (result.container <= (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(len - 0x10)) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_a8,len);
      std::operator+(&s,"Invalid restricted alphabet index ",&local_a8);
      DeadlyImportError::DeadlyImportError(pDVar3,&s);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_assign((string *)&alphabet);
  }
  alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utf8::
  utf8to32<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((utf8 *)alphabet._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(alphabet._M_dataplus._M_p + alphabet._M_string_length),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&alphabetUTF32,result);
  value = (long)alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  if (value < 2) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    to_string<unsigned_long>(&local_a8,value);
    std::operator+(&s,"Invalid restricted alphabet length ",&local_a8);
    DeadlyImportError::DeadlyImportError(pDVar3,&s);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar7 = 0;
  do {
    uVar7 = uVar7 + 1;
  } while (value >> ((byte)uVar7 & 0x3f) != 0);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  uVar8 = ~(-1 << ((byte)uVar7 & 0x1f)) & 0xff;
  uVar2 = 0;
  uVar9 = 0;
  pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  do {
    if (pvVar6 == in_RCX) {
      FIStringValue::create(&local_a8);
      sVar1 = local_a8._M_string_length;
      local_a8._M_string_length = 0;
      (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
           (_func_int **)local_a8._M_dataplus._M_p;
      (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)sVar1;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      std::__cxx11::string::~string((string *)&s);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&alphabetUTF32.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::__cxx11::string::~string((string *)&alphabet);
      sVar10.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = extraout_RDX._M_pi;
      sVar10.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<const_Assimp::FIValue>)
             sVar10.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    uVar9 = (uint)*(byte *)((long)&(pvVar6->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start +
                           *(long *)(index + 0x10)) | uVar9 << 8;
    uVar2 = uVar2 + 8;
    while (uVar5 = uVar2 - uVar7, uVar7 <= uVar2) {
      uVar4 = uVar9 >> ((byte)uVar5 & 0x1f) & uVar8;
      uVar2 = uVar5;
      if (uVar4 < value) {
        std::__cxx11::string::push_back((char)&s);
      }
      else if (uVar4 != uVar8) {
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar3,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

std::shared_ptr<const FIValue> parseRestrictedAlphabet(size_t index, size_t len) {
        std::string alphabet;
        if (index < 16) {
            switch (index) {
            case 0: // numeric
                alphabet = "0123456789-+.e ";
                break;
            case 1: // date and time
                alphabet = "0123456789-:TZ ";
                break;
            default:
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
        }
        else {
            if (index - 16 >= vocabulary.restrictedAlphabetTable.size()) {
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
            alphabet = vocabulary.restrictedAlphabetTable[index - 16];
        }
        std::vector<uint32_t> alphabetUTF32;
        utf8::utf8to32(alphabet.begin(), alphabet.end(), back_inserter(alphabetUTF32));
        std::string::size_type alphabetLength = alphabetUTF32.size();
        if (alphabetLength < 2) {
            throw DeadlyImportError("Invalid restricted alphabet length " + to_string(alphabetLength));
        }
        std::string::size_type bitsPerCharacter = 1;
        while ((1ull << bitsPerCharacter) <= alphabetLength) {
            ++bitsPerCharacter;
        }
        size_t bitsAvail = 0;
        uint8_t mask = (1 << bitsPerCharacter) - 1;
        uint32_t bits = 0;
        std::string s;
        for (size_t i = 0; i < len; ++i) {
            bits = (bits << 8) | dataP[i];
            bitsAvail += 8;
            while (bitsAvail >= bitsPerCharacter) {
                bitsAvail -= bitsPerCharacter;
                size_t charIndex = (bits >> bitsAvail) & mask;
                if (charIndex < alphabetLength) {
                    s.push_back(alphabetUTF32[charIndex]);
                }
                else if (charIndex != mask) {
                    throw DeadlyImportError(parseErrorMessage);
                }
            }
        }
        return FIStringValue::create(std::move(s));
    }